

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O0

string * UniqueObjectHelper<std::__cxx11::string>(int index)

{
  uint in_ESI;
  string *in_RDI;
  char buffer [64];
  allocator local_59;
  char local_58 [88];
  
  snprintf(local_58,0x40,"%d",(ulong)in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_58,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return in_RDI;
}

Assistant:

string UniqueObjectHelper(int index) {
  char buffer[64];
  snprintf(buffer, sizeof(buffer), "%d", index);
  return buffer;
}